

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void cgltf_node_transform_local(cgltf_node *node,cgltf_float *out_matrix)

{
  cgltf_float cVar1;
  cgltf_float cVar2;
  cgltf_float cVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float sz;
  float sy;
  float sx;
  float qw;
  float qz;
  float qy;
  float qx;
  float tz;
  float ty;
  float tx;
  cgltf_float *lm;
  cgltf_float *out_matrix_local;
  cgltf_node *node_local;
  
  if (node->has_matrix == 0) {
    cVar1 = node->translation[0];
    cVar2 = node->translation[1];
    cVar3 = node->translation[2];
    fVar4 = node->rotation[0];
    fVar5 = node->rotation[1];
    fVar6 = node->rotation[2];
    fVar7 = node->rotation[3];
    fVar8 = node->scale[0];
    fVar9 = node->scale[1];
    fVar10 = node->scale[2];
    *out_matrix = (-(fVar6 * 2.0) * fVar6 + -(fVar5 * 2.0) * fVar5 + 1.0) * fVar8;
    out_matrix[1] = (fVar4 * 2.0 * fVar5 + fVar6 * 2.0 * fVar7) * fVar8;
    out_matrix[2] = (fVar4 * 2.0 * fVar6 + -(fVar5 * 2.0 * fVar7)) * fVar8;
    out_matrix[3] = 0.0;
    out_matrix[4] = (fVar4 * 2.0 * fVar5 + -(fVar6 * 2.0 * fVar7)) * fVar9;
    out_matrix[5] = (-(fVar6 * 2.0) * fVar6 + -(fVar4 * 2.0) * fVar4 + 1.0) * fVar9;
    out_matrix[6] = (fVar5 * 2.0 * fVar6 + fVar4 * 2.0 * fVar7) * fVar9;
    out_matrix[7] = 0.0;
    out_matrix[8] = (fVar4 * 2.0 * fVar6 + fVar5 * 2.0 * fVar7) * fVar10;
    out_matrix[9] = (fVar5 * 2.0 * fVar6 + -(fVar4 * 2.0 * fVar7)) * fVar10;
    out_matrix[10] = (-(fVar5 * 2.0) * fVar5 + -(fVar4 * 2.0) * fVar4 + 1.0) * fVar10;
    out_matrix[0xb] = 0.0;
    out_matrix[0xc] = cVar1;
    out_matrix[0xd] = cVar2;
    out_matrix[0xe] = cVar3;
    out_matrix[0xf] = 1.0;
  }
  else {
    memcpy(out_matrix,node->matrix,0x40);
  }
  return;
}

Assistant:

void cgltf_node_transform_local(const cgltf_node* node, cgltf_float* out_matrix)
{
    cgltf_float* lm = out_matrix;

    if (node->has_matrix)
    {
        memcpy(lm, node->matrix, sizeof(float) * 16);
    }
    else
    {
        float tx = node->translation[0];
        float ty = node->translation[1];
        float tz = node->translation[2];

        float qx = node->rotation[0];
        float qy = node->rotation[1];
        float qz = node->rotation[2];
        float qw = node->rotation[3];

        float sx = node->scale[0];
        float sy = node->scale[1];
        float sz = node->scale[2];

        lm[0] = (1 - 2 * qy*qy - 2 * qz*qz) * sx;
        lm[1] = (2 * qx*qy + 2 * qz*qw) * sx;
        lm[2] = (2 * qx*qz - 2 * qy*qw) * sx;
        lm[3] = 0.f;

        lm[4] = (2 * qx*qy - 2 * qz*qw) * sy;
        lm[5] = (1 - 2 * qx*qx - 2 * qz*qz) * sy;
        lm[6] = (2 * qy*qz + 2 * qx*qw) * sy;
        lm[7] = 0.f;

        lm[8] = (2 * qx*qz + 2 * qy*qw) * sz;
        lm[9] = (2 * qy*qz - 2 * qx*qw) * sz;
        lm[10] = (1 - 2 * qx*qx - 2 * qy*qy) * sz;
        lm[11] = 0.f;

        lm[12] = tx;
        lm[13] = ty;
        lm[14] = tz;
        lm[15] = 1.f;
    }
}